

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  size_t sVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar16;
  undefined4 uVar17;
  undefined1 *puVar18;
  ulong uVar19;
  ulong uVar20;
  RTCIntersectArguments *pRVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  NodeRef *pNVar24;
  int iVar25;
  size_t sVar26;
  uint i;
  long lVar27;
  size_t sVar28;
  undefined1 *puVar29;
  size_t i_1;
  long lVar30;
  size_t sVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  float fVar52;
  float fVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar45;
  undefined1 auVar46 [16];
  float fVar54;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar66;
  float fVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar69;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar56;
  float fVar67;
  float fVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  float fVar83;
  uint uVar91;
  uint uVar93;
  uint uVar95;
  undefined1 auVar84 [16];
  float fVar92;
  float fVar94;
  float fVar96;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar125 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar149;
  undefined1 auVar145 [16];
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar172;
  float fVar174;
  undefined1 auVar169 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar180 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar191;
  float fVar192;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar199;
  float fVar200;
  undefined1 auVar196 [16];
  float fVar201;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  uint local_1ab8;
  uint uStack_1ab4;
  uint uStack_1ab0;
  uint uStack_1aac;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  RTCFilterFunctionNArguments args;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined1 local_1968 [16];
  undefined1 local_1958 [8];
  float fStack_1950;
  float fStack_194c;
  undefined1 local_1948 [16];
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  undefined1 local_1928 [8];
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float local_18c8;
  float fStack_18c4;
  float fStack_18c0;
  float fStack_18bc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18b8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18a8;
  uint local_1898;
  uint uStack_1894;
  uint uStack_1890;
  uint uStack_188c;
  uint local_1888;
  uint uStack_1884;
  uint uStack_1880;
  uint uStack_187c;
  uint local_1878;
  uint uStack_1874;
  uint uStack_1870;
  uint uStack_186c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  undefined8 local_1828;
  undefined8 uStack_1820;
  Vec3vf<4> Ng;
  uint local_17e8;
  uint uStack_17e4;
  uint uStack_17e0;
  uint uStack_17dc;
  uint local_17d8;
  uint uStack_17d4;
  uint uStack_17d0;
  uint uStack_17cc;
  uint local_17c8;
  uint uStack_17c4;
  uint uStack_17c0;
  uint uStack_17bc;
  uint local_17b8;
  uint uStack_17b4;
  uint uStack_17b0;
  uint uStack_17ac;
  float local_17a8;
  float fStack_17a4;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar15 = mm_lookupmask_ps._240_16_;
  auVar14 = mm_lookupmask_ps._0_16_;
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar145._8_4_ = 0xffffffff;
    auVar145._0_8_ = 0xffffffffffffffff;
    auVar145._12_4_ = 0xffffffff;
    auVar157 = *(undefined1 (*) [16])(ray + 0x80);
    auVar156._0_12_ = ZEXT812(0);
    auVar156._12_4_ = 0;
    auVar133._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar157._0_4_);
    auVar133._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar157._4_4_);
    auVar133._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar157._8_4_);
    auVar133._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar157._12_4_);
    iVar25 = movmskps((int)This,auVar133);
    if (iVar25 != 0) {
      auVar79 = *(undefined1 (*) [16])(ray + 0x40);
      auVar169 = divps(_DAT_01f46a60,auVar79);
      uVar33 = -(uint)(1e-18 <= ABS(auVar79._0_4_));
      uVar36 = -(uint)(1e-18 <= ABS(auVar79._4_4_));
      uVar39 = -(uint)(1e-18 <= ABS(auVar79._8_4_));
      uVar42 = -(uint)(1e-18 <= ABS(auVar79._12_4_));
      auVar79 = *(undefined1 (*) [16])(ray + 0x50);
      auVar180 = divps(_DAT_01f46a60,auVar79);
      uVar34 = -(uint)(1e-18 <= ABS(auVar79._0_4_));
      uVar37 = -(uint)(1e-18 <= ABS(auVar79._4_4_));
      uVar40 = -(uint)(1e-18 <= ABS(auVar79._8_4_));
      uVar43 = -(uint)(1e-18 <= ABS(auVar79._12_4_));
      auVar79 = *(undefined1 (*) [16])(ray + 0x60);
      auVar189 = divps(_DAT_01f46a60,auVar79);
      uVar35 = -(uint)(1e-18 <= ABS(auVar79._0_4_));
      uVar38 = -(uint)(1e-18 <= ABS(auVar79._4_4_));
      uVar41 = -(uint)(1e-18 <= ABS(auVar79._8_4_));
      uVar44 = -(uint)(1e-18 <= ABS(auVar79._12_4_));
      uVar82 = (uint)DAT_01f76a70;
      uVar91 = DAT_01f76a70._4_4_;
      uVar93 = DAT_01f76a70._8_4_;
      uVar95 = DAT_01f76a70._12_4_;
      auVar190._0_4_ = auVar189._0_4_ & uVar35;
      auVar190._4_4_ = auVar189._4_4_ & uVar38;
      auVar190._8_4_ = auVar189._8_4_ & uVar41;
      auVar190._12_4_ = auVar189._12_4_ & uVar44;
      auVar189._0_4_ = ~uVar35 & uVar82;
      auVar189._4_4_ = ~uVar38 & uVar91;
      auVar189._8_4_ = ~uVar41 & uVar93;
      auVar189._12_4_ = ~uVar44 & uVar95;
      auVar79 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar156);
      auVar156 = maxps(auVar157,auVar156);
      auVar80._0_4_ = auVar79._0_4_ & auVar133._0_4_;
      auVar80._4_4_ = auVar79._4_4_ & auVar133._4_4_;
      auVar80._8_4_ = auVar79._8_4_ & auVar133._8_4_;
      auVar80._12_4_ = auVar79._12_4_ & auVar133._12_4_;
      auVar196._0_8_ = CONCAT44(~auVar133._4_4_,~auVar133._0_4_) & 0x7f8000007f800000;
      auVar196._8_4_ = ~auVar133._8_4_ & 0x7f800000;
      auVar196._12_4_ = ~auVar133._12_4_ & 0x7f800000;
      auVar157._0_4_ = auVar156._0_4_ & auVar133._0_4_;
      auVar157._4_4_ = auVar156._4_4_ & auVar133._4_4_;
      auVar157._8_4_ = auVar156._8_4_ & auVar133._8_4_;
      auVar157._12_4_ = auVar156._12_4_ & auVar133._12_4_;
      auVar79._0_8_ = CONCAT44(~auVar133._4_4_,~auVar133._0_4_) & 0xff800000ff800000;
      auVar79._8_4_ = ~auVar133._8_4_ & 0xff800000;
      auVar79._12_4_ = ~auVar133._12_4_ & 0xff800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        puVar29 = (undefined1 *)0x3;
      }
      else {
        puVar29 = (undefined1 *)
                  ((ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2);
      }
      uVar7 = *(undefined8 *)ray;
      uVar8 = *(undefined8 *)(ray + 8);
      uVar9 = *(undefined8 *)(ray + 0x10);
      uVar10 = *(undefined8 *)(ray + 0x18);
      auVar156 = *(undefined1 (*) [16])(ray + 0x20);
      fVar167 = (float)(auVar169._0_4_ & uVar33 | ~uVar33 & uVar82);
      fVar172 = (float)(auVar169._4_4_ & uVar36 | ~uVar36 & uVar91);
      fVar174 = (float)(auVar169._8_4_ & uVar39 | ~uVar39 & uVar93);
      fVar176 = (float)(auVar169._12_4_ & uVar42 | ~uVar42 & uVar95);
      fVar178 = (float)(auVar180._0_4_ & uVar34 | ~uVar34 & uVar82);
      fVar181 = (float)(auVar180._4_4_ & uVar37 | ~uVar37 & uVar91);
      fVar183 = (float)(auVar180._8_4_ & uVar40 | ~uVar40 & uVar93);
      fVar185 = (float)(auVar180._12_4_ & uVar43 | ~uVar43 & uVar95);
      auVar190 = auVar190 | auVar189;
      auVar145 = auVar145 ^ auVar133;
      auVar157 = auVar157 | auVar79;
      pNVar24 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0._8_8_ = 0x7f8000007f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar196 | auVar80);
      puVar18 = mm_lookupmask_ps;
      auVar169._8_4_ = 0xffffffff;
      auVar169._0_8_ = 0xffffffffffffffff;
      auVar169._12_4_ = 0xffffffff;
      auVar79 = mm_lookupmask_ps._0_16_ ^ auVar169;
      auVar169 = mm_lookupmask_ps._240_16_ ^ auVar169;
LAB_0061303c:
      pNVar1 = pNVar24 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar24 = pNVar24 + -1;
        aVar45 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32[-1].v;
        paVar32 = paVar32 + -1;
        fVar153 = auVar157._0_4_;
        fVar158 = auVar157._4_4_;
        fVar161 = auVar157._8_4_;
        fVar164 = auVar157._12_4_;
        auVar180._4_4_ = -(uint)(aVar45.v[1] < fVar158);
        auVar180._0_4_ = -(uint)(aVar45.v[0] < fVar153);
        auVar180._8_4_ = -(uint)(aVar45.v[2] < fVar161);
        auVar180._12_4_ = -(uint)(aVar45._12_4_ < fVar164);
        uVar33 = movmskps((int)puVar18,auVar180);
        puVar18 = (undefined1 *)(ulong)uVar33;
        sVar31 = pNVar1->ptr;
        if (uVar33 != 0) {
          do {
            if ((sVar31 & 8) != 0) {
              if (sVar31 == 0xfffffffffffffff8) goto LAB_006147e9;
              auVar98._4_4_ = -(uint)(aVar45.v[1] < fVar158);
              auVar98._0_4_ = -(uint)(aVar45.v[0] < fVar153);
              auVar98._8_4_ = -(uint)(aVar45.v[2] < fVar161);
              auVar98._12_4_ = -(uint)(aVar45.v[3] < fVar164);
              uVar33 = movmskps((int)puVar18,auVar98);
              puVar18 = (undefined1 *)(ulong)uVar33;
              valid_i = (vint<4> *)&args;
              if (uVar33 == 0) goto LAB_0061303c;
              local_1948 = auVar145 ^ _DAT_01f46b70;
              lVar27 = (sVar31 & 0xfffffffffffffff0) + 0xc0;
              lVar23 = 0;
              goto LAB_00613266;
            }
            puVar18 = (undefined1 *)(sVar31 & 0xfffffffffffffff0);
            lVar27 = 0;
            sVar28 = 8;
            aVar45 = _DAT_01f45a30;
            while( true ) {
              if ((lVar27 == 4) || (sVar2 = *(size_t *)(puVar18 + lVar27 * 8), sVar2 == 8)) break;
              fVar118 = *(float *)(sVar31 + 0x20 + lVar27 * 4);
              fVar109 = *(float *)(sVar31 + 0x30 + lVar27 * 4);
              fVar112 = *(float *)(sVar31 + 0x40 + lVar27 * 4);
              fVar115 = *(float *)(sVar31 + 0x50 + lVar27 * 4);
              local_16e8 = (float)uVar7;
              fStack_16e4 = (float)((ulong)uVar7 >> 0x20);
              fStack_16e0 = (float)uVar8;
              fStack_16dc = (float)((ulong)uVar8 >> 0x20);
              auVar57._0_8_ =
                   CONCAT44((fVar118 - fStack_16e4) * fVar172,(fVar118 - local_16e8) * fVar167);
              auVar57._8_4_ = (fVar118 - fStack_16e0) * fVar174;
              auVar57._12_4_ = (fVar118 - fStack_16dc) * fVar176;
              local_16f8 = (float)uVar9;
              fStack_16f4 = (float)((ulong)uVar9 >> 0x20);
              fStack_16f0 = (float)uVar10;
              fStack_16ec = (float)((ulong)uVar10 >> 0x20);
              auVar71._0_8_ =
                   CONCAT44((fVar112 - fStack_16f4) * fVar181,(fVar112 - local_16f8) * fVar178);
              auVar71._8_4_ = (fVar112 - fStack_16f0) * fVar183;
              auVar71._12_4_ = (fVar112 - fStack_16ec) * fVar185;
              fVar118 = *(float *)(sVar31 + 0x60 + lVar27 * 4);
              local_1708 = auVar156._0_4_;
              fStack_1704 = auVar156._4_4_;
              fStack_1700 = auVar156._8_4_;
              fStack_16fc = auVar156._12_4_;
              auVar84._0_8_ =
                   CONCAT44((fVar118 - fStack_1704) * auVar190._4_4_,
                            (fVar118 - local_1708) * auVar190._0_4_);
              auVar84._8_4_ = (fVar118 - fStack_1700) * auVar190._8_4_;
              auVar84._12_4_ = (fVar118 - fStack_16fc) * auVar190._12_4_;
              auVar77._0_4_ = (fVar109 - local_16e8) * fVar167;
              auVar77._4_4_ = (fVar109 - fStack_16e4) * fVar172;
              auVar77._8_4_ = (fVar109 - fStack_16e0) * fVar174;
              auVar77._12_4_ = (fVar109 - fStack_16dc) * fVar176;
              auVar81._0_4_ = (fVar115 - local_16f8) * fVar178;
              auVar81._4_4_ = (fVar115 - fStack_16f4) * fVar181;
              auVar81._8_4_ = (fVar115 - fStack_16f0) * fVar183;
              auVar81._12_4_ = (fVar115 - fStack_16ec) * fVar185;
              fVar118 = *(float *)(sVar31 + 0x70 + lVar27 * 4);
              fVar109 = (fVar118 - local_1708) * auVar190._0_4_;
              fVar112 = (fVar118 - fStack_1704) * auVar190._4_4_;
              fVar115 = (fVar118 - fStack_1700) * auVar190._8_4_;
              fVar118 = (fVar118 - fStack_16fc) * auVar190._12_4_;
              auVar97._8_4_ = auVar57._8_4_;
              auVar97._0_8_ = auVar57._0_8_;
              auVar97._12_4_ = auVar57._12_4_;
              auVar189 = minps(auVar97,auVar77);
              auVar123._8_4_ = auVar71._8_4_;
              auVar123._0_8_ = auVar71._0_8_;
              auVar123._12_4_ = auVar71._12_4_;
              auVar180 = minps(auVar123,auVar81);
              auVar189 = maxps(auVar189,auVar180);
              auVar124._8_4_ = auVar84._8_4_;
              auVar124._0_8_ = auVar84._0_8_;
              auVar124._12_4_ = auVar84._12_4_;
              auVar5._4_4_ = fVar112;
              auVar5._0_4_ = fVar109;
              auVar5._8_4_ = fVar115;
              auVar5._12_4_ = fVar118;
              auVar180 = minps(auVar124,auVar5);
              auVar98 = maxps(auVar189,auVar180);
              auVar189 = maxps(auVar57,auVar77);
              auVar180 = maxps(auVar71,auVar81);
              auVar189 = minps(auVar189,auVar180);
              auVar6._4_4_ = fVar112;
              auVar6._0_4_ = fVar109;
              auVar6._8_4_ = fVar115;
              auVar6._12_4_ = fVar118;
              auVar180 = maxps(auVar84,auVar6);
              fVar118 = auVar98._0_4_ * 0.99999964;
              fVar109 = auVar98._4_4_ * 0.99999964;
              auVar72._4_4_ = fVar109;
              auVar72._0_4_ = fVar118;
              fVar112 = auVar98._8_4_ * 0.99999964;
              fVar115 = auVar98._12_4_ * 0.99999964;
              auVar189 = minps(auVar189,auVar180);
              auVar58._0_4_ = auVar189._0_4_ * 1.0000004;
              auVar58._4_4_ = auVar189._4_4_ * 1.0000004;
              auVar58._8_4_ = auVar189._8_4_ * 1.0000004;
              auVar58._12_4_ = auVar189._12_4_ * 1.0000004;
              auVar72._8_4_ = fVar112;
              auVar72._12_4_ = fVar115;
              auVar180 = maxps(auVar72,auVar196 | auVar80);
              auVar189 = minps(auVar58,auVar157);
              uVar34 = -(uint)(auVar180._0_4_ <= auVar189._0_4_);
              uVar35 = -(uint)(auVar180._4_4_ <= auVar189._4_4_);
              uVar36 = -(uint)(auVar180._8_4_ <= auVar189._8_4_);
              uVar37 = -(uint)(auVar180._12_4_ <= auVar189._12_4_);
              auVar73._4_4_ = uVar35;
              auVar73._0_4_ = uVar34;
              auVar73._8_4_ = uVar36;
              auVar73._12_4_ = uVar37;
              uVar33 = movmskps((int)valid_i,auVar73);
              valid_i = (vint<4> *)(ulong)uVar33;
              sVar26 = sVar28;
              aVar16 = aVar45;
              if ((uVar33 != 0) &&
                 (auVar99._0_4_ = (uint)fVar118 & uVar34, auVar99._4_4_ = (uint)fVar109 & uVar35,
                 auVar99._8_4_ = (uint)fVar112 & uVar36, auVar99._12_4_ = (uint)fVar115 & uVar37,
                 auVar74._0_8_ = CONCAT44(~uVar35,~uVar34) & 0x7f8000007f800000,
                 auVar74._8_4_ = ~uVar36 & 0x7f800000, auVar74._12_4_ = ~uVar37 & 0x7f800000,
                 sVar26 = sVar2,
                 aVar16 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar74 | auVar99),
                 sVar28 != 8)) {
                pNVar24->ptr = sVar28;
                pNVar24 = pNVar24 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar45;
                paVar32 = paVar32 + 1;
              }
              aVar45 = aVar16;
              lVar27 = lVar27 + 1;
              sVar28 = sVar26;
            }
            if (sVar28 == 8) goto LAB_0061303c;
            auVar59._4_4_ = -(uint)(aVar45.v[1] < fVar158);
            auVar59._0_4_ = -(uint)(aVar45.v[0] < fVar153);
            auVar59._8_4_ = -(uint)(aVar45.v[2] < fVar161);
            auVar59._12_4_ = -(uint)(aVar45.v[3] < fVar164);
            uVar33 = movmskps((int)puVar18,auVar59);
            valid_i = (vint<4> *)(ulong)(uVar33 & 1);
            puVar18 = (undefined1 *)
                      ((ulong)(byte)((byte)uVar33 >> 3) +
                      (ulong)((uVar33 >> 1 & 1) + (uVar33 & 1) + (uint)((uVar33 >> 2 & 1) != 0)));
            sVar31 = sVar28;
          } while (puVar29 < puVar18);
          pNVar24->ptr = sVar28;
          pNVar24 = pNVar24 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar45;
          paVar32 = paVar32 + 1;
        }
        goto LAB_0061303c;
      }
LAB_006147e9:
      *(undefined1 (*) [16])(ray + 0x80) =
           ~(auVar133 & auVar145) & *(undefined1 (*) [16])(ray + 0x80) |
           _DAT_01f45a40 & auVar133 & auVar145;
    }
  }
  return;
LAB_00613266:
  do {
    uVar33 = (uint)puVar18;
    if (lVar23 == (ulong)((uint)sVar31 & 0xf) - 8) break;
    uVar19 = lVar23 * 0xe0 + (sVar31 & 0xfffffffffffffff0);
    lVar30 = 0;
    uVar20 = uVar19;
    auVar157 = local_1948;
    do {
      uVar17 = (undefined4)uVar20;
      if (lVar30 == 4) goto LAB_0061477b;
      uVar33 = *(uint *)(lVar27 + lVar30 * 4);
      if ((ulong)uVar33 == 0xffffffff) goto LAB_0061477b;
      fStack_190c = *(float *)(lVar27 + -0xc0 + lVar30 * 4);
      fVar118 = *(float *)(lVar27 + -0xb0 + lVar30 * 4);
      fStack_18fc = *(float *)(lVar27 + -0xa0 + lVar30 * 4);
      fVar109 = *(float *)(lVar27 + -0x90 + lVar30 * 4);
      fVar112 = *(float *)(lVar27 + -0x80 + lVar30 * 4);
      fVar115 = *(float *)(lVar27 + -0x70 + lVar30 * 4);
      fVar152 = *(float *)(lVar27 + -0x60 + lVar30 * 4);
      fVar121 = *(float *)(lVar27 + -0x50 + lVar30 * 4);
      fVar129 = *(float *)(lVar27 + -0x40 + lVar30 * 4);
      fVar187 = *(float *)(lVar27 + -0x30 + lVar30 * 4);
      fVar194 = *(float *)(lVar27 + -0x20 + lVar30 * 4);
      fVar70 = *(float *)(lVar27 + -0x10 + lVar30 * 4);
      local_1828 = *(undefined8 *)(uVar19 + 0xd0);
      uStack_1820 = *(undefined8 *)(uVar19 + 0xd8);
      fVar55 = *(float *)ray;
      fVar66 = *(float *)(ray + 4);
      fVar68 = *(float *)(ray + 8);
      fVar69 = *(float *)(ray + 0xc);
      fVar168 = *(float *)(ray + 0x10);
      fVar173 = *(float *)(ray + 0x14);
      fVar175 = *(float *)(ray + 0x18);
      fVar177 = *(float *)(ray + 0x1c);
      local_1918 = fStack_190c - fVar55;
      fStack_1914 = fStack_190c - fVar66;
      fStack_1910 = fStack_190c - fVar68;
      fStack_190c = fStack_190c - fVar69;
      fVar143 = fVar118 - fVar168;
      fVar147 = fVar118 - fVar173;
      fVar149 = fVar118 - fVar175;
      fVar118 = fVar118 - fVar177;
      fVar195 = fVar109 - fVar55;
      fVar199 = fVar109 - fVar66;
      fVar200 = fVar109 - fVar68;
      fVar201 = fVar109 - fVar69;
      fVar55 = fVar187 - fVar55;
      fVar66 = fVar187 - fVar66;
      fVar68 = fVar187 - fVar68;
      fVar69 = fVar187 - fVar69;
      fVar130 = fVar112 - fVar168;
      fVar134 = fVar112 - fVar173;
      fVar137 = fVar112 - fVar175;
      fVar140 = fVar112 - fVar177;
      fVar168 = fVar194 - fVar168;
      fVar173 = fVar194 - fVar173;
      fVar175 = fVar194 - fVar175;
      fVar177 = fVar194 - fVar177;
      fVar188 = *(float *)(ray + 0x20);
      fVar191 = *(float *)(ray + 0x24);
      fVar192 = *(float *)(ray + 0x28);
      fVar193 = *(float *)(ray + 0x2c);
      local_1908 = fStack_18fc - fVar188;
      fStack_1904 = fStack_18fc - fVar191;
      fStack_1900 = fStack_18fc - fVar192;
      fStack_18fc = fStack_18fc - fVar193;
      fVar179 = fVar115 - fVar188;
      fVar182 = fVar115 - fVar191;
      fVar184 = fVar115 - fVar192;
      fVar186 = fVar115 - fVar193;
      fVar188 = fVar70 - fVar188;
      fVar191 = fVar70 - fVar191;
      fVar192 = fVar70 - fVar192;
      fVar193 = fVar70 - fVar193;
      local_1928._0_4_ = fVar55 - local_1918;
      local_1928._4_4_ = fVar66 - fStack_1914;
      fStack_1920 = fVar68 - fStack_1910;
      fStack_191c = fVar69 - fStack_190c;
      fVar110 = fVar168 - fVar143;
      fVar113 = fVar173 - fVar147;
      fVar116 = fVar175 - fVar149;
      fVar119 = fVar177 - fVar118;
      local_1938._0_4_ = fVar188 - local_1908;
      local_1938._4_4_ = fVar191 - fStack_1904;
      fStack_1930 = fVar192 - fStack_1900;
      fStack_192c = fVar193 - fStack_18fc;
      fVar52 = *(float *)(ray + 0x60);
      fVar53 = *(float *)(ray + 100);
      fVar54 = *(float *)(ray + 0x68);
      fVar56 = *(float *)(ray + 0x6c);
      auVar12 = *(undefined1 (*) [12])(ray + 0x50);
      fVar67 = *(float *)(ray + 0x5c);
      auVar189 = *(undefined1 (*) [16])(ray + 0x40);
      fVar83 = auVar189._0_4_;
      fVar92 = auVar189._4_4_;
      fVar94 = auVar189._8_4_;
      fVar96 = auVar189._12_4_;
      fVar122 = (fVar110 * (fVar188 + local_1908) - (fVar168 + fVar143) * (float)local_1938._0_4_) *
                fVar83 + ((fVar55 + local_1918) * (float)local_1938._0_4_ -
                         (fVar188 + local_1908) * (float)local_1928._0_4_) * *(float *)(ray + 0x50)
                         + ((float)local_1928._0_4_ * (fVar168 + fVar143) -
                           (fVar55 + local_1918) * fVar110) * fVar52;
      fVar126 = (fVar113 * (fVar191 + fStack_1904) - (fVar173 + fVar147) * (float)local_1938._4_4_)
                * fVar92 +
                ((fVar66 + fStack_1914) * (float)local_1938._4_4_ -
                (fVar191 + fStack_1904) * (float)local_1928._4_4_) * *(float *)(ray + 0x54) +
                ((float)local_1928._4_4_ * (fVar173 + fVar147) - (fVar66 + fStack_1914) * fVar113) *
                fVar53;
      fVar127 = (fVar116 * (fVar192 + fStack_1900) - (fVar175 + fVar149) * fStack_1930) * fVar94 +
                ((fVar68 + fStack_1910) * fStack_1930 - (fVar192 + fStack_1900) * fStack_1920) *
                *(float *)(ray + 0x58) +
                (fStack_1920 * (fVar175 + fVar149) - (fVar68 + fStack_1910) * fVar116) * fVar54;
      fVar128 = (fVar119 * (fVar193 + fStack_18fc) - (fVar177 + fVar118) * fStack_192c) * fVar96 +
                ((fVar69 + fStack_190c) * fStack_192c - (fVar193 + fStack_18fc) * fStack_191c) *
                fVar67 + (fStack_191c * (fVar177 + fVar118) - (fVar69 + fStack_190c) * fVar119) *
                         fVar56;
      fVar154 = local_1918 - fVar195;
      fVar159 = fStack_1914 - fVar199;
      fVar162 = fStack_1910 - fVar200;
      fVar165 = fStack_190c - fVar201;
      fVar111 = fVar143 - fVar130;
      fVar114 = fVar147 - fVar134;
      fVar117 = fVar149 - fVar137;
      fVar120 = fVar118 - fVar140;
      fVar131 = local_1908 - fVar179;
      fVar135 = fStack_1904 - fVar182;
      fVar138 = fStack_1900 - fVar184;
      fVar141 = fStack_18fc - fVar186;
      local_1a28 = auVar12._0_4_;
      fStack_1a24 = auVar12._4_4_;
      fStack_1a20 = auVar12._8_4_;
      local_1958._0_4_ =
           (fVar111 * (local_1908 + fVar179) - (fVar143 + fVar130) * fVar131) * fVar83 +
           ((local_1918 + fVar195) * fVar131 - (local_1908 + fVar179) * fVar154) * local_1a28 +
           (fVar154 * (fVar143 + fVar130) - (local_1918 + fVar195) * fVar111) * fVar52;
      local_1958._4_4_ =
           (fVar114 * (fStack_1904 + fVar182) - (fVar147 + fVar134) * fVar135) * fVar92 +
           ((fStack_1914 + fVar199) * fVar135 - (fStack_1904 + fVar182) * fVar159) * fStack_1a24 +
           (fVar159 * (fVar147 + fVar134) - (fStack_1914 + fVar199) * fVar114) * fVar53;
      fStack_1950 = (fVar117 * (fStack_1900 + fVar184) - (fVar149 + fVar137) * fVar138) * fVar94 +
                    ((fStack_1910 + fVar200) * fVar138 - (fStack_1900 + fVar184) * fVar162) *
                    fStack_1a20 +
                    (fVar162 * (fVar149 + fVar137) - (fStack_1910 + fVar200) * fVar117) * fVar54;
      fStack_194c = (fVar120 * (fStack_18fc + fVar186) - (fVar118 + fVar140) * fVar141) * fVar96 +
                    ((fStack_190c + fVar201) * fVar141 - (fStack_18fc + fVar186) * fVar165) * fVar67
                    + (fVar165 * (fVar118 + fVar140) - (fStack_190c + fVar201) * fVar120) * fVar56;
      fVar144 = fVar195 - fVar55;
      fVar148 = fVar199 - fVar66;
      fVar150 = fVar200 - fVar68;
      fVar151 = fVar201 - fVar69;
      fVar132 = fVar130 - fVar168;
      fVar136 = fVar134 - fVar173;
      fVar139 = fVar137 - fVar175;
      fVar142 = fVar140 - fVar177;
      fVar155 = fVar179 - fVar188;
      fVar160 = fVar182 - fVar191;
      fVar163 = fVar184 - fVar192;
      fVar166 = fVar186 - fVar193;
      auVar46._0_4_ =
           (fVar132 * (fVar188 + fVar179) - (fVar168 + fVar130) * fVar155) * fVar83 +
           ((fVar55 + fVar195) * fVar155 - (fVar188 + fVar179) * fVar144) * local_1a28 +
           (fVar144 * (fVar168 + fVar130) - (fVar55 + fVar195) * fVar132) * fVar52;
      auVar46._4_4_ =
           (fVar136 * (fVar191 + fVar182) - (fVar173 + fVar134) * fVar160) * fVar92 +
           ((fVar66 + fVar199) * fVar160 - (fVar191 + fVar182) * fVar148) * fStack_1a24 +
           (fVar148 * (fVar173 + fVar134) - (fVar66 + fVar199) * fVar136) * fVar53;
      auVar46._8_4_ =
           (fVar139 * (fVar192 + fVar184) - (fVar175 + fVar137) * fVar163) * fVar94 +
           ((fVar68 + fVar200) * fVar163 - (fVar192 + fVar184) * fVar150) * fStack_1a20 +
           (fVar150 * (fVar175 + fVar137) - (fVar68 + fVar200) * fVar139) * fVar54;
      auVar46._12_4_ =
           (fVar142 * (fVar193 + fVar186) - (fVar177 + fVar140) * fVar166) * fVar96 +
           ((fVar69 + fVar201) * fVar166 - (fVar193 + fVar186) * fVar151) * fVar67 +
           (fVar151 * (fVar177 + fVar140) - (fVar69 + fVar201) * fVar142) * fVar56;
      fVar68 = fVar122 + (float)local_1958._0_4_ + auVar46._0_4_;
      fVar69 = fVar126 + (float)local_1958._4_4_ + auVar46._4_4_;
      fVar168 = fVar127 + fStack_1950 + auVar46._8_4_;
      fVar173 = fVar128 + fStack_194c + auVar46._12_4_;
      auVar100._8_4_ = fVar127;
      auVar100._0_8_ = CONCAT44(fVar126,fVar122);
      auVar100._12_4_ = fVar128;
      auVar189 = minps(auVar100,_local_1958);
      auVar180 = minps(auVar189,auVar46);
      auVar60._8_4_ = fVar127;
      auVar60._0_8_ = CONCAT44(fVar126,fVar122);
      auVar60._12_4_ = fVar128;
      auVar189 = maxps(auVar60,_local_1958);
      auVar189 = maxps(auVar189,auVar46);
      uVar20 = CONCAT44(fVar69,fVar68) & 0x7fffffff7fffffff;
      fVar55 = ABS(fVar168) * 1.1920929e-07;
      fVar66 = ABS(fVar173) * 1.1920929e-07;
      auVar61._4_4_ = -(uint)(auVar189._4_4_ <= ABS(fVar69) * 1.1920929e-07);
      auVar61._0_4_ = -(uint)(auVar189._0_4_ <= ABS(fVar68) * 1.1920929e-07);
      auVar61._8_4_ = -(uint)(auVar189._8_4_ <= fVar55);
      auVar61._12_4_ = -(uint)(auVar189._12_4_ <= fVar66);
      auVar101._4_4_ = -(uint)(-(ABS(fVar69) * 1.1920929e-07) <= auVar180._4_4_);
      auVar101._0_4_ = -(uint)(-(ABS(fVar68) * 1.1920929e-07) <= auVar180._0_4_);
      auVar101._8_4_ = -(uint)(-fVar55 <= auVar180._8_4_);
      auVar101._12_4_ = -(uint)(-fVar66 <= auVar180._12_4_);
      auVar61 = auVar61 | auVar101;
      local_1ab8 = auVar157._0_4_;
      uStack_1ab4 = auVar157._4_4_;
      uStack_1ab0 = auVar157._8_4_;
      uStack_1aac = auVar157._12_4_;
      auVar62._0_4_ = auVar61._0_4_ & local_1ab8;
      auVar62._4_4_ = auVar61._4_4_ & uStack_1ab4;
      auVar62._8_4_ = auVar61._8_4_ & uStack_1ab0;
      auVar62._12_4_ = auVar61._12_4_ & uStack_1aac;
      iVar25 = movmskps((int)uVar19,auVar62);
      if (iVar25 != 0) {
        uVar34 = -(uint)(ABS(fVar132 * fVar131) <= ABS(fVar111 * (float)local_1938._0_4_));
        uVar37 = -(uint)(ABS(fVar136 * fVar135) <= ABS(fVar114 * (float)local_1938._4_4_));
        uVar40 = -(uint)(ABS(fVar139 * fVar138) <= ABS(fVar117 * fStack_1930));
        uVar43 = -(uint)(ABS(fVar142 * fVar141) <= ABS(fVar120 * fStack_192c));
        uVar35 = -(uint)(ABS(fVar154 * fVar155) <= ABS((float)local_1928._0_4_ * fVar131));
        uVar38 = -(uint)(ABS(fVar159 * fVar160) <= ABS((float)local_1928._4_4_ * fVar135));
        uVar41 = -(uint)(ABS(fVar162 * fVar163) <= ABS(fStack_1920 * fVar138));
        uVar44 = -(uint)(ABS(fVar165 * fVar166) <= ABS(fStack_191c * fVar141));
        uVar36 = -(uint)(ABS(fVar144 * fVar111) <= ABS(fVar154 * fVar110));
        uVar39 = -(uint)(ABS(fVar148 * fVar114) <= ABS(fVar159 * fVar113));
        uVar42 = -(uint)(ABS(fVar150 * fVar117) <= ABS(fVar162 * fVar116));
        uVar82 = -(uint)(ABS(fVar151 * fVar120) <= ABS(fVar165 * fVar119));
        local_18f8._0_4_ =
             ~uVar34 & (uint)(fVar110 * fVar131 - fVar111 * (float)local_1938._0_4_) |
             (uint)(fVar111 * fVar155 - fVar132 * fVar131) & uVar34;
        local_18f8._4_4_ =
             ~uVar37 & (uint)(fVar113 * fVar135 - fVar114 * (float)local_1938._4_4_) |
             (uint)(fVar114 * fVar160 - fVar136 * fVar135) & uVar37;
        fStack_18f0 = (float)(~uVar40 & (uint)(fVar116 * fVar138 - fVar117 * fStack_1930) |
                             (uint)(fVar117 * fVar163 - fVar139 * fVar138) & uVar40);
        fStack_18ec = (float)(~uVar43 & (uint)(fVar119 * fVar141 - fVar120 * fStack_192c) |
                             (uint)(fVar120 * fVar166 - fVar142 * fVar141) & uVar43);
        local_18e8 = (float)(~uVar35 & (uint)((float)local_1938._0_4_ * fVar154 -
                                             (float)local_1928._0_4_ * fVar131) |
                            (uint)(fVar144 * fVar131 - fVar154 * fVar155) & uVar35);
        fStack_18e4 = (float)(~uVar38 & (uint)((float)local_1938._4_4_ * fVar159 -
                                              (float)local_1928._4_4_ * fVar135) |
                             (uint)(fVar148 * fVar135 - fVar159 * fVar160) & uVar38);
        fStack_18e0 = (float)(~uVar41 & (uint)(fStack_1930 * fVar162 - fStack_1920 * fVar138) |
                             (uint)(fVar150 * fVar138 - fVar162 * fVar163) & uVar41);
        fStack_18dc = (float)(~uVar44 & (uint)(fStack_192c * fVar165 - fStack_191c * fVar141) |
                             (uint)(fVar151 * fVar141 - fVar165 * fVar166) & uVar44);
        local_18d8 = (float)(~uVar36 & (uint)((float)local_1928._0_4_ * fVar111 - fVar154 * fVar110)
                            | (uint)(fVar154 * fVar132 - fVar144 * fVar111) & uVar36);
        fStack_18d4 = (float)(~uVar39 & (uint)((float)local_1928._4_4_ * fVar114 - fVar159 * fVar113
                                              ) |
                             (uint)(fVar159 * fVar136 - fVar148 * fVar114) & uVar39);
        fStack_18d0 = (float)(~uVar42 & (uint)(fStack_1920 * fVar117 - fVar162 * fVar116) |
                             (uint)(fVar162 * fVar139 - fVar150 * fVar117) & uVar42);
        fStack_18cc = (float)(~uVar82 & (uint)(fStack_191c * fVar120 - fVar165 * fVar119) |
                             (uint)(fVar165 * fVar142 - fVar151 * fVar120) & uVar82);
        fVar55 = fVar83 * (float)local_18f8._0_4_ + local_1a28 * local_18e8 + fVar52 * local_18d8;
        fVar66 = fVar92 * (float)local_18f8._4_4_ + fStack_1a24 * fStack_18e4 + fVar53 * fStack_18d4
        ;
        fVar175 = fVar94 * fStack_18f0 + fStack_1a20 * fStack_18e0 + fVar54 * fStack_18d0;
        fVar177 = fVar96 * fStack_18ec + fVar67 * fStack_18dc + fVar56 * fStack_18cc;
        auVar85._0_4_ = fVar55 + fVar55;
        auVar85._4_4_ = fVar66 + fVar66;
        auVar85._8_4_ = fVar175 + fVar175;
        auVar85._12_4_ = fVar177 + fVar177;
        auVar75._0_4_ = local_1908 * local_18d8;
        auVar75._4_4_ = fStack_1904 * fStack_18d4;
        auVar75._8_4_ = fStack_1900 * fStack_18d0;
        auVar75._12_4_ = fStack_18fc * fStack_18cc;
        fVar177 = local_1918 * (float)local_18f8._0_4_ + fVar143 * local_18e8 + auVar75._0_4_;
        fVar188 = fStack_1914 * (float)local_18f8._4_4_ + fVar147 * fStack_18e4 + auVar75._4_4_;
        fVar191 = fStack_1910 * fStack_18f0 + fVar149 * fStack_18e0 + auVar75._8_4_;
        fVar192 = fStack_190c * fStack_18ec + fVar118 * fStack_18dc + auVar75._12_4_;
        auVar189 = rcpps(auVar75,auVar85);
        fVar118 = auVar189._0_4_;
        fVar55 = auVar189._4_4_;
        fVar66 = auVar189._8_4_;
        fVar175 = auVar189._12_4_;
        local_18c8 = ((1.0 - auVar85._0_4_ * fVar118) * fVar118 + fVar118) * (fVar177 + fVar177);
        fStack_18c4 = ((1.0 - auVar85._4_4_ * fVar55) * fVar55 + fVar55) * (fVar188 + fVar188);
        fStack_18c0 = ((1.0 - auVar85._8_4_ * fVar66) * fVar66 + fVar66) * (fVar191 + fVar191);
        fStack_18bc = ((1.0 - auVar85._12_4_ * fVar175) * fVar175 + fVar175) * (fVar192 + fVar192);
        auVar86._0_4_ =
             (int)((uint)((*(float *)(ray + 0x30) <= local_18c8 &&
                          local_18c8 <= *(float *)(ray + 0x80)) && auVar85._0_4_ != 0.0) *
                  -0x80000000) >> 0x1f;
        auVar86._4_4_ =
             (int)((uint)((*(float *)(ray + 0x34) <= fStack_18c4 &&
                          fStack_18c4 <= *(float *)(ray + 0x84)) && auVar85._4_4_ != 0.0) *
                  -0x80000000) >> 0x1f;
        auVar86._8_4_ =
             (int)((uint)((*(float *)(ray + 0x38) <= fStack_18c0 &&
                          fStack_18c0 <= *(float *)(ray + 0x88)) && auVar85._8_4_ != 0.0) *
                  -0x80000000) >> 0x1f;
        auVar86._12_4_ =
             (int)((uint)((*(float *)(ray + 0x3c) <= fStack_18bc &&
                          fStack_18bc <= *(float *)(ray + 0x8c)) && auVar85._12_4_ != 0.0) *
                  -0x80000000) >> 0x1f;
        iVar25 = movmskps(iVar25,auVar86 & auVar62);
        if (iVar25 != 0) {
          pRVar3 = (context->scene->geometries).items;
          pGVar4 = pRVar3[uVar33].ptr;
          uVar34 = pGVar4->mask;
          auVar102._0_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x90)) == 0);
          auVar102._4_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x94)) == 0);
          auVar102._8_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x98)) == 0);
          auVar102._12_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x9c)) == 0);
          auVar103 = ~auVar102 & auVar86 & auVar62;
          iVar25 = movmskps((int)pRVar3,auVar103);
          if (iVar25 == 0) {
            iVar25 = 0;
          }
          else {
            uVar17 = *(undefined4 *)((long)&local_1828 + lVar30 * 4);
            pRVar21 = context->args;
            if ((pRVar21->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar11._4_4_ = fVar69;
              auVar11._0_4_ = fVar68;
              auVar11._8_4_ = fVar168;
              auVar11._12_4_ = fVar173;
              auVar189 = rcpps(ZEXT416(uVar34),auVar11);
              fVar118 = auVar189._0_4_;
              fVar55 = auVar189._4_4_;
              fVar66 = auVar189._8_4_;
              fVar175 = auVar189._12_4_;
              fVar191 = DAT_01f46a60._4_4_;
              fVar192 = DAT_01f46a60._12_4_;
              fVar177 = (float)DAT_01f46a60;
              fVar188 = DAT_01f46a60._8_4_;
              local_17a8 = (float)uVar20;
              fStack_17a4 = (float)(uVar20 >> 0x20);
              fVar118 = (float)(-(uint)(1e-18 <= local_17a8) &
                               (uint)((fVar177 - fVar68 * fVar118) * fVar118 + fVar118));
              fVar55 = (float)(-(uint)(1e-18 <= fStack_17a4) &
                              (uint)((fVar191 - fVar69 * fVar55) * fVar55 + fVar55));
              fVar66 = (float)(-(uint)(1e-18 <= ABS(fVar168)) &
                              (uint)((fVar188 - fVar168 * fVar66) * fVar66 + fVar66));
              fVar68 = (float)(-(uint)(1e-18 <= ABS(fVar173)) &
                              (uint)((fVar192 - fVar173 * fVar175) * fVar175 + fVar175));
              auVar89._0_4_ = fVar122 * fVar118;
              auVar89._4_4_ = fVar126 * fVar55;
              auVar89._8_4_ = fVar127 * fVar66;
              auVar89._12_4_ = fVar128 * fVar68;
              auVar189 = minps(auVar89,_DAT_01f46a60);
              auVar106._0_4_ = (float)local_1958._0_4_ * fVar118;
              auVar106._4_4_ = (float)local_1958._4_4_ * fVar55;
              auVar106._8_4_ = fStack_1950 * fVar66;
              auVar106._12_4_ = fStack_194c * fVar68;
              auVar180 = minps(auVar106,_DAT_01f46a60);
              local_17b8 = auVar14._0_4_;
              uStack_17b4 = auVar14._4_4_;
              uStack_17b0 = auVar14._8_4_;
              uStack_17ac = auVar14._12_4_;
              local_17c8 = auVar79._0_4_;
              uStack_17c4 = auVar79._4_4_;
              uStack_17c0 = auVar79._8_4_;
              uStack_17bc = auVar79._12_4_;
              local_18b8.i[1] =
                   (uint)auVar180._4_4_ & uStack_17c4 |
                   (uint)(fVar191 - auVar180._4_4_) & uStack_17b4;
              local_18b8.i[0] =
                   (uint)auVar180._0_4_ & local_17c8 | (uint)(fVar177 - auVar180._0_4_) & local_17b8
              ;
              local_18b8.i[3] =
                   (uint)auVar180._12_4_ & uStack_17bc |
                   (uint)(fVar192 - auVar180._12_4_) & uStack_17ac;
              local_18b8.i[2] =
                   (uint)auVar180._8_4_ & uStack_17c0 |
                   (uint)(fVar188 - auVar180._8_4_) & uStack_17b0;
              local_18a8.i[1] =
                   (uint)auVar189._4_4_ & uStack_17c4 |
                   (uint)(fVar191 - auVar189._4_4_) & uStack_17b4;
              local_18a8.i[0] =
                   (uint)auVar189._0_4_ & local_17c8 | (uint)(fVar177 - auVar189._0_4_) & local_17b8
              ;
              local_18a8.i[2] =
                   (uint)auVar189._8_4_ & uStack_17c0 |
                   (uint)(fVar188 - auVar189._8_4_) & uStack_17b0;
              local_18a8.i[3] =
                   (uint)auVar189._12_4_ & uStack_17bc |
                   (uint)(fVar192 - auVar189._12_4_) & uStack_17ac;
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)local_18f8);
              local_18f8 = (undefined1  [8])Ng.field_0._0_8_;
              _fStack_18f0 = Ng.field_0._8_8_;
              _local_18d8 = Ng.field_0._32_8_;
              _fStack_18d0 = Ng.field_0._40_8_;
              _local_18c8 = u.field_0._0_8_;
              _fStack_18c0 = u.field_0._8_8_;
              local_18b8._0_8_ = v.field_0._0_8_;
              local_18b8._8_8_ = v.field_0._8_8_;
              local_18a8.i[1] = uVar17;
              local_18a8.i[0] = uVar17;
              local_18a8.i[2] = uVar17;
              local_18a8.i[3] = uVar17;
              local_1888 = context->user->instID[0];
              local_1878 = context->user->instPrimID[0];
              auVar189 = *(undefined1 (*) [16])(ray + 0x80);
              *(undefined1 (*) [16])(ray + 0x80) =
                   ~auVar103 & auVar189 | (undefined1  [16])t.field_0 & auVar103;
              args.valid = (int *)local_1968;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_18f8;
              args.N = 4;
              p_Var22 = pGVar4->occlusionFilterN;
              args.ray = (RTCRayN *)ray;
              local_1968 = auVar103;
              local_1898 = uVar33;
              uStack_1894 = uVar33;
              uStack_1890 = uVar33;
              uStack_188c = uVar33;
              uStack_1884 = local_1888;
              uStack_1880 = local_1888;
              uStack_187c = local_1888;
              uStack_1874 = local_1878;
              uStack_1870 = local_1878;
              uStack_186c = local_1878;
              if (p_Var22 != (RTCFilterFunctionN)0x0) {
                p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&args);
              }
              auVar49._0_4_ = -(uint)(local_1968._0_4_ == 0);
              auVar49._4_4_ = -(uint)(local_1968._4_4_ == 0);
              auVar49._8_4_ = -(uint)(local_1968._8_4_ == 0);
              auVar49._12_4_ = -(uint)(local_1968._12_4_ == 0);
              uVar33 = movmskps((int)p_Var22,auVar49);
              pRVar21 = (RTCIntersectArguments *)(ulong)(uVar33 ^ 0xf);
              if ((uVar33 ^ 0xf) == 0) {
                auVar49 = auVar49 ^ _DAT_01f46b70;
              }
              else {
                p_Var22 = context->args->filter;
                if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var22)(&args);
                }
                auVar90._0_4_ = -(uint)(local_1968._0_4_ == 0);
                auVar90._4_4_ = -(uint)(local_1968._4_4_ == 0);
                auVar90._8_4_ = -(uint)(local_1968._8_4_ == 0);
                auVar90._12_4_ = -(uint)(local_1968._12_4_ == 0);
                auVar49 = auVar90 ^ _DAT_01f46b70;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar90 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar90;
                pRVar21 = (RTCIntersectArguments *)args.ray;
              }
              auVar103._0_4_ = (auVar49._0_4_ << 0x1f) >> 0x1f;
              auVar103._4_4_ = (auVar49._4_4_ << 0x1f) >> 0x1f;
              auVar103._8_4_ = (auVar49._8_4_ << 0x1f) >> 0x1f;
              auVar103._12_4_ = (auVar49._12_4_ << 0x1f) >> 0x1f;
              *(undefined1 (*) [16])(ray + 0x80) =
                   *(undefined1 (*) [16])(ray + 0x80) & auVar103 | ~auVar103 & auVar189;
            }
            iVar25 = (int)pRVar21;
            auVar157 = ~auVar103 & auVar157;
          }
        }
      }
      iVar25 = movmskps(iVar25,auVar157);
      if (iVar25 == 0) {
        uVar17 = 0;
        goto LAB_0061477b;
      }
      fVar118 = *(float *)ray;
      fVar55 = *(float *)(ray + 4);
      fVar66 = *(float *)(ray + 8);
      fVar68 = *(float *)(ray + 0xc);
      fVar69 = *(float *)(ray + 0x10);
      fVar168 = *(float *)(ray + 0x14);
      fVar173 = *(float *)(ray + 0x18);
      fVar175 = *(float *)(ray + 0x1c);
      fVar177 = *(float *)(ray + 0x20);
      fVar188 = *(float *)(ray + 0x24);
      fVar191 = *(float *)(ray + 0x28);
      fVar192 = *(float *)(ray + 0x2c);
      fVar144 = fVar152 - fVar118;
      fVar147 = fVar152 - fVar55;
      fVar148 = fVar152 - fVar66;
      fVar152 = fVar152 - fVar68;
      fVar128 = fVar121 - fVar69;
      fVar130 = fVar121 - fVar168;
      fVar131 = fVar121 - fVar173;
      fVar121 = fVar121 - fVar175;
      fVar132 = fVar129 - fVar177;
      fVar134 = fVar129 - fVar188;
      fVar135 = fVar129 - fVar191;
      fVar129 = fVar129 - fVar192;
      fVar149 = fVar187 - fVar118;
      fVar150 = fVar187 - fVar55;
      fVar151 = fVar187 - fVar66;
      fVar187 = fVar187 - fVar68;
      fVar154 = fVar194 - fVar69;
      fVar159 = fVar194 - fVar168;
      fVar162 = fVar194 - fVar173;
      fVar194 = fVar194 - fVar175;
      fVar56 = fVar70 - fVar177;
      fVar67 = fVar70 - fVar188;
      fVar83 = fVar70 - fVar191;
      fVar70 = fVar70 - fVar192;
      fVar118 = fVar109 - fVar118;
      fVar55 = fVar109 - fVar55;
      fVar66 = fVar109 - fVar66;
      fVar109 = fVar109 - fVar68;
      fVar69 = fVar112 - fVar69;
      fVar168 = fVar112 - fVar168;
      fVar173 = fVar112 - fVar173;
      fVar112 = fVar112 - fVar175;
      fVar177 = fVar115 - fVar177;
      fVar188 = fVar115 - fVar188;
      fVar191 = fVar115 - fVar191;
      fVar115 = fVar115 - fVar192;
      local_1958._0_4_ = fVar118 - fVar144;
      local_1958._4_4_ = fVar55 - fVar147;
      fStack_1950 = fVar66 - fVar148;
      fStack_194c = fVar109 - fVar152;
      local_1908 = fVar69 - fVar128;
      fStack_1904 = fVar168 - fVar130;
      fStack_1900 = fVar173 - fVar131;
      fStack_18fc = fVar112 - fVar121;
      fVar136 = fVar177 - fVar132;
      fVar138 = fVar188 - fVar134;
      fVar140 = fVar191 - fVar135;
      fVar142 = fVar115 - fVar129;
      fVar68 = *(float *)(ray + 0x60);
      uVar13 = *(undefined8 *)(ray + 0x60);
      fVar175 = *(float *)(ray + 0x68);
      fVar192 = *(float *)(ray + 0x6c);
      fVar193 = fVar144 - fVar149;
      fVar52 = fVar147 - fVar150;
      fVar53 = fVar148 - fVar151;
      fVar54 = fVar152 - fVar187;
      local_1998 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1994 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1990 = (float)*(undefined8 *)(ray + 0x58);
      fStack_198c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      fVar114 = fVar128 - fVar154;
      fVar116 = fVar130 - fVar159;
      fVar117 = fVar131 - fVar162;
      fVar119 = fVar121 - fVar194;
      local_1a28 = (float)*(undefined8 *)(ray + 0x40);
      fStack_1a24 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_1a20 = (float)*(undefined8 *)(ray + 0x48);
      fStack_1a1c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      fVar120 = (local_1908 * (fVar177 + fVar132) - (fVar69 + fVar128) * fVar136) * local_1a28 +
                ((fVar118 + fVar144) * fVar136 - (fVar177 + fVar132) * (float)local_1958._0_4_) *
                local_1998 +
                ((float)local_1958._0_4_ * (fVar69 + fVar128) - (fVar118 + fVar144) * local_1908) *
                fVar68;
      fVar122 = (fStack_1904 * (fVar188 + fVar134) - (fVar168 + fVar130) * fVar138) * fStack_1a24 +
                ((fVar55 + fVar147) * fVar138 - (fVar188 + fVar134) * (float)local_1958._4_4_) *
                fStack_1994 +
                ((float)local_1958._4_4_ * (fVar168 + fVar130) - (fVar55 + fVar147) * fStack_1904) *
                *(float *)(ray + 100);
      fVar126 = (fStack_1900 * (fVar191 + fVar135) - (fVar173 + fVar131) * fVar140) * fStack_1a20 +
                ((fVar66 + fVar148) * fVar140 - (fVar191 + fVar135) * fStack_1950) * fStack_1990 +
                (fStack_1950 * (fVar173 + fVar131) - (fVar66 + fVar148) * fStack_1900) * fVar175;
      fVar127 = (fStack_18fc * (fVar115 + fVar129) - (fVar112 + fVar121) * fVar142) * fStack_1a1c +
                ((fVar109 + fVar152) * fVar142 - (fVar115 + fVar129) * fStack_194c) * fStack_198c +
                (fStack_194c * (fVar112 + fVar121) - (fVar109 + fVar152) * fStack_18fc) * fVar192;
      local_1918 = fVar132 - fVar56;
      fStack_1914 = fVar134 - fVar67;
      fStack_1910 = fVar135 - fVar83;
      fStack_190c = fVar129 - fVar70;
      fVar92 = (float)uVar13;
      fVar94 = (float)((ulong)uVar13 >> 0x20);
      auVar170._0_4_ =
           (fVar114 * (fVar132 + fVar56) - (fVar128 + fVar154) * local_1918) * local_1a28 +
           ((fVar144 + fVar149) * local_1918 - (fVar132 + fVar56) * fVar193) * local_1998 +
           (fVar193 * (fVar128 + fVar154) - (fVar144 + fVar149) * fVar114) * fVar92;
      auVar170._4_4_ =
           (fVar116 * (fVar134 + fVar67) - (fVar130 + fVar159) * fStack_1914) * fStack_1a24 +
           ((fVar147 + fVar150) * fStack_1914 - (fVar134 + fVar67) * fVar52) * fStack_1994 +
           (fVar52 * (fVar130 + fVar159) - (fVar147 + fVar150) * fVar116) * fVar94;
      auVar170._8_4_ =
           (fVar117 * (fVar135 + fVar83) - (fVar131 + fVar162) * fStack_1910) * fStack_1a20 +
           ((fVar148 + fVar151) * fStack_1910 - (fVar135 + fVar83) * fVar53) * fStack_1990 +
           (fVar53 * (fVar131 + fVar162) - (fVar148 + fVar151) * fVar117) * fVar175;
      auVar170._12_4_ =
           (fVar119 * (fVar129 + fVar70) - (fVar121 + fVar194) * fStack_190c) * fStack_1a1c +
           ((fVar152 + fVar187) * fStack_190c - (fVar129 + fVar70) * fVar54) * fStack_198c +
           (fVar54 * (fVar121 + fVar194) - (fVar152 + fVar187) * fVar119) * fVar192;
      fVar96 = fVar149 - fVar118;
      fVar110 = fVar150 - fVar55;
      fVar111 = fVar151 - fVar66;
      fVar113 = fVar187 - fVar109;
      fVar137 = fVar154 - fVar69;
      fVar139 = fVar159 - fVar168;
      fVar141 = fVar162 - fVar173;
      fVar143 = fVar194 - fVar112;
      fVar155 = fVar56 - fVar177;
      fVar160 = fVar67 - fVar188;
      fVar163 = fVar83 - fVar191;
      fVar165 = fVar70 - fVar115;
      auVar125._0_4_ =
           (fVar137 * (fVar177 + fVar56) - (fVar69 + fVar154) * fVar155) * local_1a28 +
           ((fVar118 + fVar149) * fVar155 - (fVar177 + fVar56) * fVar96) * local_1998 +
           (fVar96 * (fVar69 + fVar154) - (fVar118 + fVar149) * fVar137) * fVar92;
      auVar125._4_4_ =
           (fVar139 * (fVar188 + fVar67) - (fVar168 + fVar159) * fVar160) * fStack_1a24 +
           ((fVar55 + fVar150) * fVar160 - (fVar188 + fVar67) * fVar110) * fStack_1994 +
           (fVar110 * (fVar168 + fVar159) - (fVar55 + fVar150) * fVar139) * fVar94;
      auVar125._8_4_ =
           (fVar141 * (fVar191 + fVar83) - (fVar173 + fVar162) * fVar163) * fStack_1a20 +
           ((fVar66 + fVar151) * fVar163 - (fVar191 + fVar83) * fVar111) * fStack_1990 +
           (fVar111 * (fVar173 + fVar162) - (fVar66 + fVar151) * fVar141) * fVar175;
      auVar125._12_4_ =
           (fVar143 * (fVar115 + fVar70) - (fVar112 + fVar194) * fVar165) * fStack_1a1c +
           ((fVar109 + fVar187) * fVar165 - (fVar115 + fVar70) * fVar113) * fStack_198c +
           (fVar113 * (fVar112 + fVar194) - (fVar109 + fVar187) * fVar143) * fVar192;
      local_1928._0_4_ = fVar120 + auVar170._0_4_ + auVar125._0_4_;
      local_1928._4_4_ = fVar122 + auVar170._4_4_ + auVar125._4_4_;
      fStack_1920 = fVar126 + auVar170._8_4_ + auVar125._8_4_;
      fStack_191c = fVar127 + auVar170._12_4_ + auVar125._12_4_;
      auVar146._8_4_ = fVar126;
      auVar146._0_8_ = CONCAT44(fVar122,fVar120);
      auVar146._12_4_ = fVar127;
      auVar189 = minps(auVar146,auVar170);
      auVar189 = minps(auVar189,auVar125);
      auVar197._8_4_ = fVar126;
      auVar197._0_8_ = CONCAT44(fVar122,fVar120);
      auVar197._12_4_ = fVar127;
      auVar180 = maxps(auVar197,auVar170);
      auVar180 = maxps(auVar180,auVar125);
      uVar20 = CONCAT44(local_1928._4_4_,local_1928._0_4_);
      auVar87._0_8_ = uVar20 & 0x7fffffff7fffffff;
      auVar87._8_4_ = ABS(fStack_1920);
      auVar87._12_4_ = ABS(fStack_191c);
      local_1ab8 = auVar157._0_4_;
      uStack_1ab4 = auVar157._4_4_;
      uStack_1ab0 = auVar157._8_4_;
      uStack_1aac = auVar157._12_4_;
      auVar198._0_4_ =
           -(uint)(auVar180._0_4_ <= ABS((float)local_1928._0_4_) * 1.1920929e-07 ||
                  -(ABS((float)local_1928._0_4_) * 1.1920929e-07) <= auVar189._0_4_) & local_1ab8;
      auVar198._4_4_ =
           -(uint)(auVar180._4_4_ <= ABS((float)local_1928._4_4_) * 1.1920929e-07 ||
                  -(ABS((float)local_1928._4_4_) * 1.1920929e-07) <= auVar189._4_4_) & uStack_1ab4;
      auVar198._8_4_ =
           -(uint)(auVar180._8_4_ <= auVar87._8_4_ * 1.1920929e-07 ||
                  -(auVar87._8_4_ * 1.1920929e-07) <= auVar189._8_4_) & uStack_1ab0;
      auVar198._12_4_ =
           -(uint)(auVar180._12_4_ <= auVar87._12_4_ * 1.1920929e-07 ||
                  -(auVar87._12_4_ * 1.1920929e-07) <= auVar189._12_4_) & uStack_1aac;
      iVar25 = movmskps(iVar25,auVar198);
      if (iVar25 != 0) {
        uVar33 = -(uint)(ABS(fVar137 * local_1918) <= ABS(fVar114 * fVar136));
        uVar36 = -(uint)(ABS(fVar139 * fStack_1914) <= ABS(fVar116 * fVar138));
        uVar39 = -(uint)(ABS(fVar141 * fStack_1910) <= ABS(fVar117 * fVar140));
        uVar42 = -(uint)(ABS(fVar143 * fStack_190c) <= ABS(fVar119 * fVar142));
        uVar34 = -(uint)(ABS(fVar193 * fVar155) <= ABS((float)local_1958._0_4_ * local_1918));
        uVar37 = -(uint)(ABS(fVar52 * fVar160) <= ABS((float)local_1958._4_4_ * fStack_1914));
        uVar40 = -(uint)(ABS(fVar53 * fVar163) <= ABS(fStack_1950 * fStack_1910));
        uVar43 = -(uint)(ABS(fVar54 * fVar165) <= ABS(fStack_194c * fStack_190c));
        uVar35 = -(uint)(ABS(fVar96 * fVar114) <= ABS(fVar193 * local_1908));
        uVar38 = -(uint)(ABS(fVar110 * fVar116) <= ABS(fVar52 * fStack_1904));
        uVar41 = -(uint)(ABS(fVar111 * fVar117) <= ABS(fVar53 * fStack_1900));
        uVar44 = -(uint)(ABS(fVar113 * fVar119) <= ABS(fVar54 * fStack_18fc));
        local_18f8._0_4_ =
             ~uVar33 & (uint)(local_1908 * local_1918 - fVar114 * fVar136) |
             (uint)(fVar114 * fVar155 - fVar137 * local_1918) & uVar33;
        local_18f8._4_4_ =
             ~uVar36 & (uint)(fStack_1904 * fStack_1914 - fVar116 * fVar138) |
             (uint)(fVar116 * fVar160 - fVar139 * fStack_1914) & uVar36;
        fStack_18f0 = (float)(~uVar39 & (uint)(fStack_1900 * fStack_1910 - fVar117 * fVar140) |
                             (uint)(fVar117 * fVar163 - fVar141 * fStack_1910) & uVar39);
        fStack_18ec = (float)(~uVar42 & (uint)(fStack_18fc * fStack_190c - fVar119 * fVar142) |
                             (uint)(fVar119 * fVar165 - fVar143 * fStack_190c) & uVar42);
        auVar78._0_4_ = (uint)(fVar96 * local_1918 - fVar193 * fVar155) & uVar34;
        auVar78._4_4_ = (uint)(fVar110 * fStack_1914 - fVar52 * fVar160) & uVar37;
        auVar78._8_4_ = (uint)(fVar111 * fStack_1910 - fVar53 * fVar163) & uVar40;
        auVar78._12_4_ = (uint)(fVar113 * fStack_190c - fVar54 * fVar165) & uVar43;
        auVar88._0_4_ = ~uVar34 & (uint)(fVar136 * fVar193 - (float)local_1958._0_4_ * local_1918);
        auVar88._4_4_ = ~uVar37 & (uint)(fVar138 * fVar52 - (float)local_1958._4_4_ * fStack_1914);
        auVar88._8_4_ = ~uVar40 & (uint)(fVar140 * fVar53 - fStack_1950 * fStack_1910);
        auVar88._12_4_ = ~uVar43 & (uint)(fVar142 * fVar54 - fStack_194c * fStack_190c);
        _local_18e8 = auVar88 | auVar78;
        local_18d8 = (float)(~uVar35 & (uint)((float)local_1958._0_4_ * fVar114 -
                                             fVar193 * local_1908) |
                            (uint)(fVar193 * fVar137 - fVar96 * fVar114) & uVar35);
        fStack_18d4 = (float)(~uVar38 & (uint)((float)local_1958._4_4_ * fVar116 -
                                              fVar52 * fStack_1904) |
                             (uint)(fVar52 * fVar139 - fVar110 * fVar116) & uVar38);
        fStack_18d0 = (float)(~uVar41 & (uint)(fStack_1950 * fVar117 - fVar53 * fStack_1900) |
                             (uint)(fVar53 * fVar141 - fVar111 * fVar117) & uVar41);
        fStack_18cc = (float)(~uVar44 & (uint)(fStack_194c * fVar119 - fVar54 * fStack_18fc) |
                             (uint)(fVar54 * fVar143 - fVar113 * fVar119) & uVar44);
        fVar118 = local_1a28 * (float)local_18f8._0_4_ +
                  local_1998 * local_18e8 + fVar68 * local_18d8;
        fVar109 = fStack_1a24 * (float)local_18f8._4_4_ +
                  fStack_1994 * local_18e8._4_4_ + *(float *)(ray + 100) * fStack_18d4;
        fVar112 = fStack_1a20 * fStack_18f0 + fStack_1990 * local_18e8._8_4_ + fVar175 * fStack_18d0
        ;
        fVar115 = fStack_1a1c * fStack_18ec +
                  fStack_198c * local_18e8._12_4_ + fVar192 * fStack_18cc;
        auVar104._0_4_ = fVar118 + fVar118;
        auVar104._4_4_ = fVar109 + fVar109;
        auVar104._8_4_ = fVar112 + fVar112;
        auVar104._12_4_ = fVar115 + fVar115;
        auVar47._0_4_ = fVar132 * local_18d8;
        auVar47._4_4_ = fVar134 * fStack_18d4;
        auVar47._8_4_ = fVar135 * fStack_18d0;
        auVar47._12_4_ = fVar129 * fStack_18cc;
        fVar129 = fVar144 * (float)local_18f8._0_4_ + fVar128 * local_18e8 + auVar47._0_4_;
        fVar187 = fVar147 * (float)local_18f8._4_4_ + fVar130 * local_18e8._4_4_ + auVar47._4_4_;
        fVar194 = fVar148 * fStack_18f0 + fVar131 * local_18e8._8_4_ + auVar47._8_4_;
        fVar152 = fVar152 * fStack_18ec + fVar121 * local_18e8._12_4_ + auVar47._12_4_;
        auVar189 = rcpps(auVar47,auVar104);
        fVar118 = auVar189._0_4_;
        fVar109 = auVar189._4_4_;
        fVar112 = auVar189._8_4_;
        fVar115 = auVar189._12_4_;
        local_18c8 = ((1.0 - auVar104._0_4_ * fVar118) * fVar118 + fVar118) * (fVar129 + fVar129);
        fStack_18c4 = ((1.0 - auVar104._4_4_ * fVar109) * fVar109 + fVar109) * (fVar187 + fVar187);
        fStack_18c0 = ((1.0 - auVar104._8_4_ * fVar112) * fVar112 + fVar112) * (fVar194 + fVar194);
        fStack_18bc = ((1.0 - auVar104._12_4_ * fVar115) * fVar115 + fVar115) * (fVar152 + fVar152);
        auVar105._0_4_ =
             (int)((uint)(auVar104._0_4_ != 0.0 &&
                         (local_18c8 <= *(float *)(ray + 0x80) &&
                         *(float *)(ray + 0x30) <= local_18c8)) * -0x80000000) >> 0x1f;
        auVar105._4_4_ =
             (int)((uint)(auVar104._4_4_ != 0.0 &&
                         (fStack_18c4 <= *(float *)(ray + 0x84) &&
                         *(float *)(ray + 0x34) <= fStack_18c4)) * -0x80000000) >> 0x1f;
        auVar105._8_4_ =
             (int)((uint)(auVar104._8_4_ != 0.0 &&
                         (fStack_18c0 <= *(float *)(ray + 0x88) &&
                         *(float *)(ray + 0x38) <= fStack_18c0)) * -0x80000000) >> 0x1f;
        auVar105._12_4_ =
             (int)((uint)(auVar104._12_4_ != 0.0 &&
                         (fStack_18bc <= *(float *)(ray + 0x8c) &&
                         *(float *)(ray + 0x3c) <= fStack_18bc)) * -0x80000000) >> 0x1f;
        iVar25 = movmskps(iVar25,auVar105 & auVar198);
        if (iVar25 != 0) {
          uVar33 = *(uint *)(lVar27 + lVar30 * 4);
          pRVar3 = (context->scene->geometries).items;
          pGVar4 = pRVar3[uVar33].ptr;
          uVar34 = pGVar4->mask;
          auVar63._0_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x90)) == 0);
          auVar63._4_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x94)) == 0);
          auVar63._8_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x98)) == 0);
          auVar63._12_4_ = -(uint)((uVar34 & *(uint *)(ray + 0x9c)) == 0);
          auVar64 = ~auVar63 & auVar105 & auVar198;
          iVar25 = movmskps((int)pRVar3,auVar64);
          if (iVar25 == 0) {
            iVar25 = 0;
          }
          else {
            uVar17 = *(undefined4 *)((long)&local_1828 + lVar30 * 4);
            pRVar21 = context->args;
            if ((pRVar21->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar189 = rcpps(ZEXT416(uVar34),_local_1928);
              fVar118 = auVar189._0_4_;
              fVar109 = auVar189._4_4_;
              fVar112 = auVar189._8_4_;
              fVar115 = auVar189._12_4_;
              fVar129 = DAT_01f46a60._4_4_;
              fVar187 = DAT_01f46a60._12_4_;
              fVar152 = (float)DAT_01f46a60;
              fVar121 = DAT_01f46a60._8_4_;
              local_1938._0_4_ = (undefined4)auVar87._0_8_;
              local_1938._4_4_ = (undefined4)(auVar87._0_8_ >> 0x20);
              fVar118 = (float)(-(uint)(1e-18 <= (float)local_1938._0_4_) &
                               (uint)((fVar152 - (float)local_1928._0_4_ * fVar118) * fVar118 +
                                     fVar118));
              fVar109 = (float)(-(uint)(1e-18 <= (float)local_1938._4_4_) &
                               (uint)((fVar129 - (float)local_1928._4_4_ * fVar109) * fVar109 +
                                     fVar109));
              fVar112 = (float)(-(uint)(1e-18 <= auVar87._8_4_) &
                               (uint)((fVar121 - fStack_1920 * fVar112) * fVar112 + fVar112));
              fVar115 = (float)(-(uint)(1e-18 <= auVar87._12_4_) &
                               (uint)((fVar187 - fStack_191c * fVar115) * fVar115 + fVar115));
              auVar107._0_4_ = fVar120 * fVar118;
              auVar107._4_4_ = fVar122 * fVar109;
              auVar107._8_4_ = fVar126 * fVar112;
              auVar107._12_4_ = fVar127 * fVar115;
              auVar189 = minps(auVar107,_DAT_01f46a60);
              auVar171._0_4_ = auVar170._0_4_ * fVar118;
              auVar171._4_4_ = auVar170._4_4_ * fVar109;
              auVar171._8_4_ = auVar170._8_4_ * fVar112;
              auVar171._12_4_ = auVar170._12_4_ * fVar115;
              auVar180 = minps(auVar171,_DAT_01f46a60);
              local_17d8 = auVar15._0_4_;
              uStack_17d4 = auVar15._4_4_;
              uStack_17d0 = auVar15._8_4_;
              uStack_17cc = auVar15._12_4_;
              auVar48._0_4_ = (uint)(fVar152 - auVar189._0_4_) & local_17d8;
              auVar48._4_4_ = (uint)(fVar129 - auVar189._4_4_) & uStack_17d4;
              auVar48._8_4_ = (uint)(fVar121 - auVar189._8_4_) & uStack_17d0;
              auVar48._12_4_ = (uint)(fVar187 - auVar189._12_4_) & uStack_17cc;
              local_17e8 = auVar169._0_4_;
              uStack_17e4 = auVar169._4_4_;
              uStack_17e0 = auVar169._8_4_;
              uStack_17dc = auVar169._12_4_;
              auVar108._0_4_ = (uint)auVar189._0_4_ & local_17e8;
              auVar108._4_4_ = (uint)auVar189._4_4_ & uStack_17e4;
              auVar108._8_4_ = (uint)auVar189._8_4_ & uStack_17e0;
              auVar108._12_4_ = (uint)auVar189._12_4_ & uStack_17dc;
              local_18a8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar108 | auVar48);
              local_18b8.i[1] =
                   (uint)auVar180._4_4_ & uStack_17e4 |
                   (uint)(fVar129 - auVar180._4_4_) & uStack_17d4;
              local_18b8.i[0] =
                   (uint)auVar180._0_4_ & local_17e8 | (uint)(fVar152 - auVar180._0_4_) & local_17d8
              ;
              local_18b8.i[3] =
                   (uint)auVar180._12_4_ & uStack_17dc |
                   (uint)(fVar187 - auVar180._12_4_) & uStack_17cc;
              local_18b8.i[2] =
                   (uint)auVar180._8_4_ & uStack_17e0 |
                   (uint)(fVar121 - auVar180._8_4_) & uStack_17d0;
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              _local_1938 = auVar87;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)local_18f8);
              local_18f8 = (undefined1  [8])Ng.field_0._0_8_;
              _fStack_18f0 = Ng.field_0._8_8_;
              _local_18d8 = Ng.field_0._32_8_;
              _fStack_18d0 = Ng.field_0._40_8_;
              _local_18c8 = u.field_0._0_8_;
              _fStack_18c0 = u.field_0._8_8_;
              local_18b8._0_8_ = v.field_0._0_8_;
              local_18b8._8_8_ = v.field_0._8_8_;
              local_18a8.i[1] = uVar17;
              local_18a8.i[0] = uVar17;
              local_18a8.i[2] = uVar17;
              local_18a8.i[3] = uVar17;
              local_1888 = context->user->instID[0];
              local_1878 = context->user->instPrimID[0];
              auVar189 = *(undefined1 (*) [16])(ray + 0x80);
              *(undefined1 (*) [16])(ray + 0x80) =
                   ~auVar64 & auVar189 | (undefined1  [16])t.field_0 & auVar64;
              args.valid = (int *)local_1968;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_18f8;
              args.N = 4;
              p_Var22 = pGVar4->occlusionFilterN;
              args.ray = (RTCRayN *)ray;
              local_1968 = auVar64;
              local_1898 = uVar33;
              uStack_1894 = uVar33;
              uStack_1890 = uVar33;
              uStack_188c = uVar33;
              uStack_1884 = local_1888;
              uStack_1880 = local_1888;
              uStack_187c = local_1888;
              uStack_1874 = local_1878;
              uStack_1870 = local_1878;
              uStack_186c = local_1878;
              if (p_Var22 != (RTCFilterFunctionN)0x0) {
                p_Var22 = (RTCFilterFunctionN)(*p_Var22)(&args);
              }
              auVar50._0_4_ = -(uint)(local_1968._0_4_ == 0);
              auVar50._4_4_ = -(uint)(local_1968._4_4_ == 0);
              auVar50._8_4_ = -(uint)(local_1968._8_4_ == 0);
              auVar50._12_4_ = -(uint)(local_1968._12_4_ == 0);
              uVar33 = movmskps((int)p_Var22,auVar50);
              pRVar21 = (RTCIntersectArguments *)(ulong)(uVar33 ^ 0xf);
              if ((uVar33 ^ 0xf) == 0) {
                auVar50 = auVar50 ^ _DAT_01f46b70;
              }
              else {
                p_Var22 = context->args->filter;
                if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var22)(&args);
                }
                auVar76._0_4_ = -(uint)(local_1968._0_4_ == 0);
                auVar76._4_4_ = -(uint)(local_1968._4_4_ == 0);
                auVar76._8_4_ = -(uint)(local_1968._8_4_ == 0);
                auVar76._12_4_ = -(uint)(local_1968._12_4_ == 0);
                auVar50 = auVar76 ^ _DAT_01f46b70;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar76 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar76;
                pRVar21 = (RTCIntersectArguments *)args.ray;
              }
              auVar64._0_4_ = (auVar50._0_4_ << 0x1f) >> 0x1f;
              auVar64._4_4_ = (auVar50._4_4_ << 0x1f) >> 0x1f;
              auVar64._8_4_ = (auVar50._8_4_ << 0x1f) >> 0x1f;
              auVar64._12_4_ = (auVar50._12_4_ << 0x1f) >> 0x1f;
              *(undefined1 (*) [16])(ray + 0x80) =
                   *(undefined1 (*) [16])(ray + 0x80) & auVar64 | ~auVar64 & auVar189;
            }
            iVar25 = (int)pRVar21;
            auVar157 = ~auVar64 & auVar157;
          }
        }
      }
      uVar33 = movmskps(iVar25,auVar157);
      uVar20 = (ulong)uVar33;
      lVar30 = lVar30 + 1;
    } while (uVar33 != 0);
    uVar17 = 0;
LAB_0061477b:
    local_1948._0_4_ = local_1948._0_4_ & auVar157._0_4_;
    local_1948._4_4_ = local_1948._4_4_ & auVar157._4_4_;
    local_1948._8_4_ = local_1948._8_4_ & auVar157._8_4_;
    local_1948._12_4_ = local_1948._12_4_ & auVar157._12_4_;
    uVar33 = movmskps(uVar17,local_1948);
    puVar18 = (undefined1 *)(ulong)uVar33;
    lVar23 = lVar23 + 1;
    lVar27 = lVar27 + 0xe0;
  } while (uVar33 != 0);
  valid_i = (vint<4> *)&args;
  auVar145 = auVar145 | local_1948 ^ _DAT_01f46b70;
  uVar33 = movmskps(uVar33,auVar145);
  puVar18 = (undefined1 *)(ulong)uVar33;
  if (uVar33 == 0xf) goto LAB_006147e9;
  auVar51._0_8_ = auVar145._0_8_ & 0xff800000ff800000;
  auVar51._8_4_ = auVar145._8_4_ & 0xff800000;
  auVar51._12_4_ = auVar145._12_4_ & 0xff800000;
  auVar65._0_4_ = ~auVar145._0_4_ & (uint)fVar153;
  auVar65._4_4_ = ~auVar145._4_4_ & (uint)fVar158;
  auVar65._8_4_ = ~auVar145._8_4_ & (uint)fVar161;
  auVar65._12_4_ = ~auVar145._12_4_ & (uint)fVar164;
  auVar157 = auVar65 | auVar51;
  goto LAB_0061303c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }